

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O0

void __thiscall
iDynTree::optimalcontrol::anon_struct_560_16_3a89ef90::resizeBuffers<unsigned_long>
          (anon_struct_560_16_3a89ef90 *this,unsigned_long stateDim,unsigned_long controlDim)

{
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  uint nu;
  uint nx;
  
  iDynTree::VectorDynSize::resize(in_RDI + 0x88);
  iDynTree::VectorDynSize::zero();
  iDynTree::VectorDynSize::resize(in_RDI + 0xa8);
  iDynTree::VectorDynSize::zero();
  iDynTree::MatrixDynSize::resize(in_RDI + 0x10,(ulong)in_ESI);
  iDynTree::MatrixDynSize::zero();
  iDynTree::MatrixDynSize::resize(in_RDI + 0x38,(ulong)in_EDX);
  iDynTree::MatrixDynSize::zero();
  iDynTree::MatrixDynSize::resize(in_RDI + 0x60,(ulong)in_ESI);
  iDynTree::MatrixDynSize::zero();
  return;
}

Assistant:

void resizeBuffers(intType stateDim, intType controlDim) {
                unsigned int nx = static_cast<unsigned int>(stateDim);
                unsigned int nu = static_cast<unsigned int>(controlDim);
                stateJacobianBuffer.resize(nx);
                stateJacobianBuffer.zero();
                controlJacobianBuffer.resize(nu);
                controlJacobianBuffer.zero();
                stateHessianBuffer.resize(nx, nx);
                stateHessianBuffer.zero();
                controlHessianBuffer.resize(nu, nu);
                controlHessianBuffer.zero();
                mixedHessianBuffer.resize(nx, nu);
                mixedHessianBuffer.zero();
            }